

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::OneofDescriptorProto::MergeFrom
          (OneofDescriptorProto *this,OneofDescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  string *initial_value;
  string *psVar3;
  LogMessage *other;
  OneofOptions *pOVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x168c);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      initial_value = (from->name_).ptr_;
      psVar3 = (this->name_).ptr_;
      if (psVar3 != initial_value) {
        if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,initial_value);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar3);
        }
      }
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->options_ == (OneofOptions *)0x0) {
        pOVar4 = (OneofOptions *)operator_new(0x68);
        OneofOptions::OneofOptions(pOVar4);
        this->options_ = pOVar4;
      }
      pOVar4 = from->options_;
      if (pOVar4 == (OneofOptions *)0x0) {
        pOVar4 = (OneofOptions *)&_OneofOptions_default_instance_;
      }
      OneofOptions::MergeFrom(this->options_,pOVar4);
    }
  }
  return;
}

Assistant:

void OneofDescriptorProto::MergeFrom(const OneofDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.OneofDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 3u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_options()->::google::protobuf::OneofOptions::MergeFrom(from.options());
    }
  }
}